

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type this_00;
  value_type vVar2;
  char *file;
  key_type rhs_expression;
  uint *lhs;
  AssertHelper *this_01;
  AssertHelper *this_02;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht2_2;
  TypeParam ht1_2;
  AssertionResult gtest_ar;
  TypeParam ht2_1;
  TypeParam ht1_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff750;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff758;
  allocator_type *in_stack_fffffffffffff760;
  key_equal *in_stack_fffffffffffff768;
  int line;
  hasher *in_stack_fffffffffffff770;
  size_type in_stack_fffffffffffff778;
  Type type;
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff780;
  char *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7b8;
  char *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  uint i;
  AssertHelper *in_stack_fffffffffffff7d0;
  AssertionResult local_790;
  value_type *in_stack_fffffffffffff888;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff890;
  AssertionResult local_760 [6];
  value_type local_6f8;
  key_type local_6f0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_6e8 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_618 [14];
  size_type local_538;
  undefined4 local_52c;
  AssertionResult local_528 [6];
  value_type local_4c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_4b8 [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3e8 [13];
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  string local_2d0 [55];
  byte local_299;
  AssertionResult local_298 [6];
  value_type local_230;
  value_type local_1d0;
  key_type local_1c8;
  key_type local_1c0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1b8 [14];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d8 [13];
  
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_1b8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_1b8);
  local_1c0 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff750,
                    (key_type *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  local_1c8 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff750,
                    (key_type *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  local_1d0 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_230 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==(in_stack_fffffffffffff750,
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  local_299 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff750,
             (bool *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),(type *)0xb7db2d)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,(Type)(in_stack_fffffffffffff778 >> 0x20),
               (char *)in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)in_stack_fffffffffffff760);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff7d0,
               (Message *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    std::__cxx11::string::~string(local_2d0);
    testing::Message::~Message((Message *)0xb7dc71);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7dd08);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff750,
              (HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  local_2e1 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==(in_stack_fffffffffffff750,
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff750,
             (bool *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),(type *)0xb7dd66)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
               in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,(Type)(in_stack_fffffffffffff778 >> 0x20),
               (char *)in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)in_stack_fffffffffffff760);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff7d0,
               (Message *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    std::__cxx11::string::~string(local_318);
    testing::Message::~Message((Message *)0xb7de3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7ded2);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7dedf);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7deec);
  i = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  this_02 = (AssertHelper *)(ulong)i;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3e8,i,(int *)this_02);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3e8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_4b8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_4b8);
  local_4c0 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff750,
              (HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  local_52c = 0;
  local_538 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb7e069);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff760,
             (uint *)in_stack_fffffffffffff758,(unsigned_long *)in_stack_fffffffffffff750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::AssertionResult::failure_message((AssertionResult *)0xb7e18b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,(Type)(in_stack_fffffffffffff778 >> 0x20),
               (char *)in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)in_stack_fffffffffffff760);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0xb7e1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7e259);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7e266);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7e273);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_618,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_618);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_6e8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_6e8);
  this_00 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
  local_6f0 = this_00;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff750,
                    (key_type *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  vVar2 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),0);
  local_6f8 = vVar2;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  type = vVar2.second;
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff750,
              (HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  file = (char *)google::
                 BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::size((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xb7e40c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff768,(char *)in_stack_fffffffffffff760,
             (uint *)in_stack_fffffffffffff758,(unsigned_long *)in_stack_fffffffffffff750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_760);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff768 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb7e52e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,file,(int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)in_stack_fffffffffffff760);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0xb7e58b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7e5fc);
  rhs_expression =
       HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_fffffffffffff758,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
  lhs = (uint *)google::
                BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::count(in_stack_fffffffffffff750,
                        (key_type *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff768,(char *)rhs_expression,lhs,
             (unsigned_long *)in_stack_fffffffffffff750);
  line = (int)((ulong)in_stack_fffffffffffff768 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_790);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb7e6c9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,file,line,(char *)rhs_expression);
    testing::internal::AssertHelper::operator=
              (this_02,(Message *)CONCAT44(i,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xb7e726);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb7e791);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7e79e);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7e7ab);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}